

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O1

void testTiledYa(string *tempDir)

{
  pointer pcVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  _func_void_Array2D<Imf_3_2::Rgba>_ptr_int_int *in_R8;
  uint uVar6;
  string fileName;
  long *local_68 [2];
  long local_58 [2];
  Box2i local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing tiled luminance input and output",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_68[0] = local_58;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  bVar2 = IlmThread_3_2::supportsThreads();
  uVar6 = 0;
  do {
    cVar3 = IlmThread_3_2::supportsThreads();
    if (cVar3 != '\0') {
      Imf_3_2::setGlobalThreadCount(uVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar4 = Imf_3_2::globalThreadCount();
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar4);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
    local_48.min.x = -0x11;
    local_48.min.y = -0x1d;
    local_48.max.x = 0x15c;
    local_48.max.y = 0x22c;
    anon_unknown.dwarf_32b84a::writeReadYa
              (&local_48,(int)local_68[0],0x1b7df8,(char *)CONCAT71(in_register_00000009,in_CL),
               in_R8);
    anon_unknown.dwarf_32b84a::writeReadYa
              (&local_48,(int)local_68[0],0x1b80d8,(char *)CONCAT71(in_register_00000009,in_CL),
               in_R8);
    in_CL = uVar6 < 3;
    uVar6 = uVar6 + 1;
  } while ((bVar2 & in_CL) != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void
testTiledYa (const std::string& tempDir)
{
    try
    {
        cout << "Testing tiled luminance input and output" << endl;

        std::string fileName = tempDir + "imf_test_tiled_ya.exr";

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            Box2i dataWindow (V2i (-17, -29), V2i (348, 556));
            writeReadYa (dataWindow, 19, 27, fileName.c_str (), waves);
            writeReadYa (dataWindow, 19, 27, fileName.c_str (), wheel);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}